

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  bool bVar1;
  int iVar2;
  AlphaNum *__return_storage_ptr__;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  AlphaNum *a;
  int max_field_number;
  int iVar3;
  int i32;
  AlphaNum *this_00;
  long lVar4;
  int i;
  long lVar5;
  allocator local_e1;
  AlphaNum local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string message_id;
  
  __return_storage_ptr__ = &local_e0;
  (anonymous_namespace)::GetMessagePathPrefix_abi_cxx11_
            ((string *)__return_storage_ptr__,(_anonymous_namespace_ *)options,
             (GeneratorOptions *)desc,desc);
  io::Printer::Print<char[12],std::__cxx11::string,char[10],std::__cxx11::string>
            (printer,
             "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classprefix$$classname$ = function(opt_data) {\n"
             ,(char (*) [12])"classprefix",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             __return_storage_ptr__,(char (*) [10])0x3a498c,
             *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)desc);
  std::__cxx11::string::~string((string *)&local_e0);
  io::Printer::Annotate<google::protobuf::Descriptor>(printer,"classname",desc);
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string((string *)&local_70,"0",&local_e1);
  lVar4 = 0;
  iVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(desc + 0x68); lVar5 = lVar5 + 1) {
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)(*(long *)(desc + 0x28) + lVar4));
    if ((!bVar1) && (iVar2 = *(int *)(*(long *)(desc + 0x28) + 0x44 + lVar4), iVar3 < iVar2)) {
      iVar3 = iVar2;
    }
    lVar4 = lVar4 + 0x98;
  }
  iVar2 = 499;
  if (iVar3 < 499) {
    iVar2 = iVar3;
  }
  i32 = -1;
  if (499 < iVar3) {
    i32 = iVar2 + 1;
  }
  if (0 < *(int *)(desc + 0x78)) {
    i32 = iVar2 + 1;
  }
  strings::AlphaNum::AlphaNum(&local_e0,i32);
  this_00 = &local_e0;
  StrCat_abi_cxx11_(&local_90,(protobuf *)this_00,a);
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,(Descriptor *)this_00);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              ((string *)&local_e0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)__return_storage_ptr__);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
                   (anonymous_namespace)::kRepeatedFieldArrayName);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  else {
    std::__cxx11::string::string((string *)&local_b0,"null",(allocator *)&local_e0);
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            ((string *)&local_e0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)__return_storage_ptr__);
  args_1 = &local_70;
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[10],std::__cxx11::string,char[12],std::__cxx11::string>
            (printer,
             "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
             ,(char (*) [10])"messageId",args_1,(char (*) [6])"pivot",&local_90,
             (char (*) [10])"rptfields",&local_b0,(char (*) [12])"oneoffields",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            ((string *)&local_e0,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)args_1);
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,
             "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  /**\n   * @public\n   * @override\n   */\n  $classname$.displayName = \'$classname$\';\n}\n"
             ,(char (*) [10])0x3a498c,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0);
  std::__cxx11::string::~string((string *)&local_e0);
  std::__cxx11::string::~string((string *)&message_id);
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classprefix$$classname$ = function(opt_data) {\n",
      "classprefix", GetMessagePathPrefix(options, desc), "classname",
      desc->name());
  printer->Annotate("classname", desc);
  std::string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId",
      !message_id.empty() ? ("'" + message_id + "'")
                          : (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc), "rptfields",
      RepeatedFieldsArrayName(options, desc), "oneoffields",
      OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      // displayName overrides Function.prototype.displayName
      // http://google3/javascript/externs/es3.js?l=511
      "  /**\n"
      "   * @public\n"
      "   * @override\n"
      "   */\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}